

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O1

EulerAngles * __thiscall
KDIS::DATA_TYPE::EulerAngles::operator-(EulerAngles *this,EulerAngles *Value)

{
  KFLOAT32 KVar1;
  EulerAngles *tmp;
  EulerAngles *in_RDI;
  
  (in_RDI->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_002235b0;
  KVar1 = this->m_f32Theta;
  in_RDI->m_f32Psi = this->m_f32Psi;
  in_RDI->m_f32Theta = KVar1;
  in_RDI->m_f32Phi = this->m_f32Phi;
  in_RDI->m_f32Psi = (KFLOAT32)((float)in_RDI->m_f32Psi - (float)Value->m_f32Psi);
  in_RDI->m_f32Theta = (KFLOAT32)((float)in_RDI->m_f32Theta - (float)Value->m_f32Theta);
  in_RDI->m_f32Phi = (KFLOAT32)((float)in_RDI->m_f32Phi - (float)Value->m_f32Phi);
  return in_RDI;
}

Assistant:

EulerAngles EulerAngles::operator - ( const EulerAngles & Value ) const
{
    EulerAngles tmp = *this;
    tmp.m_f32Psi   -= Value.m_f32Psi;
    tmp.m_f32Theta -= Value.m_f32Theta;
    tmp.m_f32Phi   -= Value.m_f32Phi;
    return tmp;
}